

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

void ZSTD_updateRep(U32 *rep,U32 offBase,U32 ll0)

{
  uint uVar1;
  U32 local_28;
  U32 local_24;
  U32 currentOffset;
  U32 repCode;
  U32 ll0_local;
  U32 offBase_local;
  U32 *rep_local;
  
  if (offBase < 4) {
    if ((offBase == 0) || (3 < offBase)) {
      __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
    }
    uVar1 = (offBase - 1) + ll0;
    if (uVar1 != 0) {
      if (uVar1 == 3) {
        local_24 = *rep - 1;
      }
      else {
        local_24 = rep[uVar1];
      }
      if (uVar1 < 2) {
        local_28 = rep[2];
      }
      else {
        local_28 = rep[1];
      }
      rep[2] = local_28;
      rep[1] = *rep;
      *rep = local_24;
    }
  }
  else {
    rep[2] = rep[1];
    rep[1] = *rep;
    if (offBase < 4) {
      __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2d3,"void ZSTD_updateRep(U32 *, const U32, const U32)");
    }
    *rep = offBase - 3;
  }
  return;
}

Assistant:

MEM_STATIC void
ZSTD_updateRep(U32 rep[ZSTD_REP_NUM], U32 const offBase, U32 const ll0)
{
    if (OFFBASE_IS_OFFSET(offBase)) {  /* full offset */
        rep[2] = rep[1];
        rep[1] = rep[0];
        rep[0] = OFFBASE_TO_OFFSET(offBase);
    } else {   /* repcode */
        U32 const repCode = OFFBASE_TO_REPCODE(offBase) - 1 + ll0;
        if (repCode > 0) {  /* note : if repCode==0, no change */
            U32 const currentOffset = (repCode==ZSTD_REP_NUM) ? (rep[0] - 1) : rep[repCode];
            rep[2] = (repCode >= 2) ? rep[1] : rep[2];
            rep[1] = rep[0];
            rep[0] = currentOffset;
        } else {   /* repCode == 0 */
            /* nothing to do */
        }
    }
}